

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O1

void __thiscall
ScriptBuilder_StringBuildTest_Test::TestBody(ScriptBuilder_StringBuildTest_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_4;
  ScriptBuilder sb;
  string expect_hex;
  string expect_asm;
  Script script;
  Script local_118;
  AssertHelper local_e0;
  AssertHelper local_d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined **local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  AssertHelper local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_98 [16];
  AssertHelper local_88 [2];
  undefined1 local_78 [72];
  
  cfd::core::Script::Script((Script *)(local_78 + 0x10));
  local_c8 = &PTR__ScriptBuilder_004e50b8;
  local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppuVar1 = (pointer *)
            ((long)&local_118.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"5","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"2","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"OP_ADD","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"OP_CHECKSIG","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ScriptBuilder::Build();
      cfd::core::Script::operator=((Script *)(local_78 + 0x10),&local_118);
      cfd::core::Script::~Script(&local_118);
    }
  }
  else {
    testing::Message::Message((Message *)&local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe3,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a8,"script.GetHex().c_str()","\"555293ac\"",
             (char *)local_118._vptr_Script,"555293ac");
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe4,pcVar3);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a8,"script.ToString().c_str()","\"5 2 OP_ADD OP_CHECKSIG\"",
             (char *)local_118._vptr_Script,"5 2 OP_ADD OP_CHECKSIG");
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118._vptr_Script = (_func_int **)&PTR__ScriptBuilder_004e50b8;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&local_c0,&local_118.script_data_.data_);
  local_118._vptr_Script = (_func_int **)&PTR__ScriptBuilder_004e50b8;
  if (local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"0","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"17","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"8738","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"3355443","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"17476","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"85","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"26214","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"7829367","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"-2184","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"-25","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ScriptBuilder::Build();
      cfd::core::Script::operator=((Script *)(local_78 + 0x10),&local_118);
      cfd::core::Script::~Script(&local_118);
    }
  }
  else {
    testing::Message::Message((Message *)&local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf3,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a8,"script.GetHex().c_str()",
             "\"000111022222033333330244440155026666037777770288880199\"",
             (char *)local_118._vptr_Script,"000111022222033333330244440155026666037777770288880199"
            );
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf5,pcVar3);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a8,"script.ToString().c_str()",
             "\"0 17 8738 3355443 17476 85 26214 7829367 -2184 -25\"",(char *)local_118._vptr_Script
             ,"0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8.data_ = (AssertHelperData *)local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac"
             ,"");
  local_88[0].data_ = (AssertHelperData *)local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG"
             ,"");
  local_118._vptr_Script = (_func_int **)&PTR__ScriptBuilder_004e50b8;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&local_c0,&local_118.script_data_.data_);
  local_118._vptr_Script = (_func_int **)&PTR__ScriptBuilder_004e50b8;
  if (local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e"
             ,"");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,
             "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0"
             ,"");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"144","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"OP_CHECKLOCKTIMEVERIFY","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"OP_DROP","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"1469272661","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"OP_SHA256","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4"
             ,"");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"OP_EQUALVERIFY","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"OP_CHECKSIG","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ScriptBuilder::Build();
      cfd::core::Script::operator=((Script *)(local_78 + 0x10),&local_118);
      cfd::core::Script::~Script(&local_118);
    }
  }
  else {
    testing::Message::Message((Message *)&local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x109,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"script.GetHex().c_str()","expect_hex.c_str()",
             (char *)local_118._vptr_Script,(char *)local_a8.data_);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x10a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"script.ToString().c_str()","expect_asm.c_str()",
             (char *)local_118._vptr_Script,(char *)local_88[0].data_);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x10b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118._vptr_Script = (_func_int **)&PTR__ScriptBuilder_004e50b8;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&local_c0,&local_118.script_data_.data_);
  local_118._vptr_Script = (_func_int **)&PTR__ScriptBuilder_004e50b8;
  if (local_118.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"0x00","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"0x11","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"0x2222","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  local_118._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"0x333333","");
  cfd::core::ScriptBuilder::AppendString((string *)&local_c8);
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ScriptBuilder::Build();
      cfd::core::Script::operator=((Script *)(local_78 + 0x10),&local_118);
      cfd::core::Script::~Script(&local_118);
    }
  }
  else {
    testing::Message::Message((Message *)&local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x114,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"script.GetHex().c_str()","\"0100011102222203333333\"",
             (char *)local_118._vptr_Script,"0100011102222203333333");
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x116,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d8,"script.ToString().c_str()","\"0 17 8738 3355443\"",
             (char *)local_118._vptr_Script,"0 17 8738 3355443");
  if (local_118._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_118._vptr_Script);
  }
  if (local_d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x118,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_118._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_118._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_118._vptr_Script + 8))();
      }
      local_118._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_88[0].data_ != (AssertHelperData *)local_78) {
    operator_delete(local_88[0].data_);
  }
  if (local_a8.data_ != (AssertHelperData *)local_98) {
    operator_delete(local_a8.data_);
  }
  local_c8 = &PTR__ScriptBuilder_004e50b8;
  if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script((Script *)(local_78 + 0x10));
  return;
}

Assistant:

TEST(ScriptBuilder, StringBuildTest) {
  Script script;
  ScriptBuilder sb = ScriptBuilder();
  sb.AppendString("5");
  sb.AppendString("2");
  sb.AppendString("OP_ADD");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), "555293ac");
  EXPECT_STREQ(script.ToString().c_str(), "5 2 OP_ADD OP_CHECKSIG");

  sb = ScriptBuilder();
  sb.AppendString("0");
  sb.AppendString("17");
  sb.AppendString("8738");
  sb.AppendString("3355443");
  sb.AppendString("17476");
  sb.AppendString("85");
  sb.AppendString("26214");
  sb.AppendString("7829367");
  sb.AppendString("-2184");
  sb.AppendString("-25");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "000111022222033333330244440155026666037777770288880199");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG";// NOLINT
  sb = ScriptBuilder();
  sb.AppendString("304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e");
  sb.AppendString("042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0");
  sb.AppendString("144");
  sb.AppendString("OP_CHECKLOCKTIMEVERIFY");
  sb.AppendString("OP_DROP");
  sb.AppendString("1469272661");
  sb.AppendString("OP_SHA256");
  sb.AppendString("f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4");
  sb.AppendString("OP_EQUALVERIFY");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), expect_hex.c_str());
  EXPECT_STREQ(script.ToString().c_str(), expect_asm.c_str());

  // hex test
  sb = ScriptBuilder();
  sb.AppendString("0x00");
  sb.AppendString("0x11");
  sb.AppendString("0x2222");
  sb.AppendString("0x333333");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "0100011102222203333333");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443");
}